

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::hasAdditionalOps(string *unit_string)

{
  long lVar1;
  undefined1 local_11;
  string *unit_string_local;
  
  std::__cxx11::string::find_last_of((char)unit_string,0x7b);
  lVar1 = std::__cxx11::string::find_last_of((char *)unit_string,0x21108d);
  local_11 = true;
  if (lVar1 == -1) {
    std::__cxx11::string::find_last_of((char)unit_string,0x7d);
    lVar1 = std::__cxx11::string::find_first_of((char *)unit_string,0x21108d);
    local_11 = lVar1 != -1;
  }
  return local_11;
}

Assistant:

static bool hasAdditionalOps(const std::string& unit_string)
{
    return (unit_string.find_last_of("*^(/", unit_string.find_last_of('{')) !=
            std::string::npos) ||
        (unit_string.find_first_of("*^(/", unit_string.find_last_of('}')) !=
         std::string::npos);
}